

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

int32_t __thiscall icu_63::RBBITableBuilder::getSafeTableSize(RBBITableBuilder *this)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t rowSize;
  int32_t numCols;
  int32_t numRows;
  int32_t size;
  RBBITableBuilder *this_local;
  
  if (this->fSafeTable == (UVector *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = UVector::size(this->fSafeTable);
    iVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
    this_local._4_4_ = iVar1 * (iVar2 * 2 + 8) + 0x10;
  }
  return this_local._4_4_;
}

Assistant:

int32_t  RBBITableBuilder::getSafeTableSize() const {
    int32_t    size = 0;
    int32_t    numRows;
    int32_t    numCols;
    int32_t    rowSize;

    if (fSafeTable == nullptr) {
        return 0;
    }

    size    = offsetof(RBBIStateTable, fTableData);    // The header, with no rows to the table.

    numRows = fSafeTable->size();
    numCols = fRB->fSetBuilder->getNumCharCategories();

    rowSize = offsetof(RBBIStateTableRow, fNextState) + sizeof(uint16_t)*numCols;
    size   += numRows * rowSize;
    return size;
}